

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

void __thiscall TypeChecker::visit(TypeChecker *this,UnaryNode *node)

{
  _Optional_payload_base<TypeName> _Var1;
  bool bVar2;
  ExpressionNode *pEVar3;
  optional<TypeName> *poVar4;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  long in_RDI;
  optional<TypeName> termType;
  TypeChecker checker;
  Node *in_stack_00000158;
  string *in_stack_00000160;
  SymbolTable *in_stack_ffffffffffffff58;
  TypeChecker *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  TypeChecker local_28;
  
  TypeChecker(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pEVar3 = UnaryNode::getTerm((UnaryNode *)0x1787e2);
  (*(pEVar3->super_Node)._vptr_Node[2])(pEVar3,&local_28);
  poVar4 = getType(&local_28);
  _Var1 = (poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
          super__Optional_payload_base<TypeName>;
  bVar2 = std::optional<TypeName>::has_value((optional<TypeName> *)0x178820);
  uVar5 = false;
  if (bVar2) {
    in_stack_ffffffffffffff6e =
         std::operator!=((optional<TypeName> *)in_stack_ffffffffffffff60,
                         (TypeName *)in_stack_ffffffffffffff58);
    uVar5 = in_stack_ffffffffffffff6e;
  }
  if ((__optional_ne_t<TypeName,_TypeName>)uVar5 != false) {
    this_00 = (unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)std::optional<TypeName>::value((optional<TypeName> *)in_stack_ffffffffffffff60);
    std::
    unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(this_00,(key_type *)in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                   (char *)this_00);
    reportError(in_stack_00000160,in_stack_00000158);
  }
  *(_Optional_payload_base<TypeName> *)(in_RDI + 8) = _Var1;
  ~TypeChecker((TypeChecker *)0x17892d);
  return;
}

Assistant:

void TypeChecker::visit(const UnaryNode& node)
{
  TypeChecker checker{symbols_};
  node.getTerm().accept(checker);
  auto termType = checker.getType();
  if(termType.has_value() && termType != TypeName::F32)
    reportError("Invalid operation on value of type " + 
      TypeNameStrings.at(termType.value()) + "!", node);
  
  type_ = termType;
}